

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Check
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool expectFull,bool expectPending
          )

{
  code *pcVar1;
  bool bVar2;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar3;
  undefined4 *puVar4;
  uint uVar5;
  char *message;
  char *error;
  uint lineNumber;
  
  if (this->freeObjectList == this->lastFreeObjectHead) {
    CheckFreeBitVector(this,false);
  }
  else {
    CheckDebugFreeBitVector(this,false);
  }
  bVar2 = false;
  uVar5 = (uint)(this->super_HeapBlock).heapBlockType;
  if ((uVar5 < 0xb) && ((0x528U >> (uVar5 & 0x1f) & 1) != 0)) {
    pSVar3 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock);
    bVar2 = pSVar3->disposedObjectList != (FreeObject *)0x0 || pSVar3->pendingDisposeCount != 0;
  }
  if (bVar2 != expectPending) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x6bf,"(expectPending == HasAnyDisposeObjects())",
                       "expectPending == HasAnyDisposeObjects()");
    if (!bVar2) goto LAB_006b81c7;
    *puVar4 = 0;
  }
  if ((this->isInAllocator == false) && (this->isClearedFromAllocator != true)) {
    bVar2 = false;
    if (this->freeObjectList == (FreeObject *)0x0) {
      bVar2 = true;
      uVar5 = (uint)(this->super_HeapBlock).heapBlockType;
      if ((uVar5 < 0xb) && ((0x528U >> (uVar5 & 0x1f) & 1) != 0)) {
        pSVar3 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                           (&this->super_HeapBlock);
        bVar2 = pSVar3->disposedObjectList == (FreeObject *)0x0 && pSVar3->pendingDisposeCount == 0;
      }
    }
    if (bVar2 == expectFull) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    error = "(expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects()))";
    message = "expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects())";
    lineNumber = 0x6cc;
  }
  else {
    if (expectFull && !expectPending) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    error = "(expectFull && !expectPending)";
    message = "expectFull && !expectPending";
    lineNumber = 0x6c8;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar4 = 0;
    return;
  }
LAB_006b81c7:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::Check(bool expectFull, bool expectPending)
{
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    // If we allocated from this block during the concurrent sweep the free bit vectors would be invalid.
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
    if (!this->wasAllocatedFromDuringSweep)
#endif
#endif
    {
        if (this->IsFreeBitsValid())
        {
            CheckFreeBitVector(false);
        }
        else
        {
            CheckDebugFreeBitVector(false);
        }
    }

    Assert(expectPending == HasAnyDisposeObjects());

    // As the blocks are added to the SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
    {
        if (this->isInAllocator || this->isClearedFromAllocator)
        {
            Assert(expectFull && !expectPending);
        }
        else
        {
            Assert(expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects()));
        }
    }
}